

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O0

void net_uv::TCPSocket::uv_on_after_read(uv_stream_t *handle,ssize_t nread,uv_buf_t *buf)

{
  TCPSocket *s;
  uv_buf_t *buf_local;
  ssize_t nread_local;
  uv_stream_t *handle_local;
  
  if (nread < 1) {
    (**(code **)(*handle->data + 0x38))();
    Socket::uv_on_free_buffer((uv_handle_t *)handle,buf);
  }
  else {
    std::function<void_(char_*,_long)>::operator()
              ((function<void_(char_*,_long)> *)((long)handle->data + 0x80),buf->base,nread);
    Socket::uv_on_free_buffer((uv_handle_t *)handle,buf);
  }
  return;
}

Assistant:

void TCPSocket::uv_on_after_read(uv_stream_t *handle, ssize_t nread, const uv_buf_t *buf) 
{
	TCPSocket* s = (TCPSocket*)handle->data;
	if (nread <= 0) 
	{
		s->disconnect();
		uv_on_free_buffer((uv_handle_t*)handle, buf);
		return;
	}
	s->m_recvCall(buf->base, nread);
	uv_on_free_buffer((uv_handle_t*)handle, buf);
}